

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  char *local_58;
  long local_50;
  char local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," selected ",10);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"test","");
  if (this->n == 1) {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
  }
  else {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_38,local_38 + local_30);
    std::__cxx11::string::append((char *)&local_58);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }